

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * __thiscall
vkt::shaderexecutor::Constant<float>::doEvaluate(Constant<float> *this,EvalContext *param_2)

{
  float fVar1;
  double dVar2;
  IVal *in_RDI;
  double dVar3;
  
  fVar1 = this->m_value;
  dVar3 = (double)fVar1;
  in_RDI->m_hasNaN = NAN(fVar1);
  dVar2 = dVar3;
  if (NAN(fVar1)) {
    dVar3 = -INFINITY;
    dVar2 = INFINITY;
  }
  in_RDI->m_lo = dVar2;
  in_RDI->m_hi = dVar3;
  return in_RDI;
}

Assistant:

IVal	doEvaluate		(const EvalContext&) const	{ return makeIVal(m_value); }